

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O3

string * Potassco::ProgramOptions::quote(string *__return_storage_ptr__,string *x)

{
  char *pcVar1;
  long *plVar2;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar3;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"\'","");
  pcVar1 = (char *)std::__cxx11::string::_M_append((char *)local_40,(ulong)(x->_M_dataplus)._M_p);
  plVar2 = (long *)std::__cxx11::string::append(pcVar1);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*plVar2,plVar2[1] + *plVar2);
  psVar3 = extraout_RAX;
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
    psVar3 = extraout_RAX_00;
  }
  return psVar3;
}

Assistant:

static std::string quote(const std::string& x) {
	return std::string("'").append(x).append("'");
}